

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O3

void handlebars::
     dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
     ::push_event<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *signal,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  event_type local_50;
  
  paVar1 = &local_50.signal.field_2;
  pcVar2 = (signal->_M_dataplus)._M_p;
  local_50.signal._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + signal->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_50.args,args);
  std::
  deque<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type,std::allocator<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>>
  ::
  emplace_back<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>
            ((deque<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type,std::allocator<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>>
              *)&dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::m_event_queue,&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_50.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.signal._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.signal._M_dataplus._M_p,
                    local_50.signal.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
				dispatcher<SignalT, HandlerArgTs...>::push_event(const SignalT& signal, FwdHandlerArgTs&&... args)
		{
				m_event_queue.emplace_back(event_type{
						signal, args_storage_type{ std::forward<FwdHandlerArgTs>(args)... } });
		}